

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O0

int inform_bin_bounds(double *series,size_t n,double *bounds,size_t m,int *binned,inform_error *err)

{
  int local_58;
  int local_54;
  ulong uStack_50;
  int x;
  size_t i;
  int b;
  inform_error *err_local;
  int *binned_local;
  size_t m_local;
  double *bounds_local;
  size_t n_local;
  double *series_local;
  
  if (series == (double *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
    }
    series_local._4_4_ = 0;
  }
  else if (n == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ESHORTSERIES;
    }
    series_local._4_4_ = 0;
  }
  else if ((bounds == (double *)0x0) || (m == 0)) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EBIN;
    }
    series_local._4_4_ = 0;
  }
  else if (binned == (int *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
    }
    series_local._4_4_ = 0;
  }
  else {
    i._4_4_ = 0;
    for (uStack_50 = 0; uStack_50 < n; uStack_50 = uStack_50 + 1) {
      binned[uStack_50] = (int)m;
      for (local_54 = 0; local_54 < (int)m; local_54 = local_54 + 1) {
        if (series[uStack_50] < bounds[local_54]) {
          binned[uStack_50] = local_54;
          break;
        }
      }
      if (i._4_4_ < binned[uStack_50]) {
        local_58 = binned[uStack_50];
      }
      else {
        local_58 = i._4_4_;
      }
      i._4_4_ = local_58;
    }
    series_local._4_4_ = i._4_4_ + 1;
  }
  return series_local._4_4_;
}

Assistant:

int inform_bin_bounds(double const *series, size_t n, double const *bounds,
    size_t m, int *binned, inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0);
    else if (bounds == NULL || m == 0)
        INFORM_ERROR_RETURN(err, INFORM_EBIN, 0);
    else if (binned == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);

    int b = 0;
    for (size_t i = 0; i < n; ++i)
    {
        binned[i] = (int)m;
        for (int x = 0; x < (int)m; ++x)
        {
            if (series[i] < bounds[x])
            {
                binned[i] = x;
                break;
            }
        }
        b = (b < binned[i]) ? binned[i] : b;
    }

    return b + 1;
}